

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

Value * __thiscall Potassco::ProgramOptions::Value::desc(Value *this,DescType t,char *n)

{
  byte bVar1;
  ValueDesc VVar2;
  char *pcVar3;
  char *in_RDX;
  uint in_ESI;
  Value *in_RDI;
  uint oldKey;
  char *oldVal;
  
  if ((in_RDX != (char *)0x0) &&
     ((in_ESI != 4 || (setProperty(in_RDI,property_implicit), *in_RDX != '\0')))) {
    if ((in_RDI->descFlag_ == '\0') || (in_RDI->descFlag_ == in_ESI)) {
      (in_RDI->desc_).value = in_RDX;
      in_RDI->descFlag_ = (byte_t)in_ESI;
    }
    else {
      if (in_RDI->descFlag_ != '\b') {
        VVar2 = in_RDI->desc_;
        bVar1 = in_RDI->descFlag_;
        pcVar3 = (char *)operator_new(0x18);
        (in_RDI->desc_).value = pcVar3;
        pcVar3 = (in_RDI->desc_).value;
        pcVar3[0x10] = '\0';
        pcVar3[0x11] = '\0';
        pcVar3[0x12] = '\0';
        pcVar3[0x13] = '\0';
        pcVar3[0x14] = '\0';
        pcVar3[0x15] = '\0';
        pcVar3[0x16] = '\0';
        pcVar3[0x17] = '\0';
        pcVar3 = (in_RDI->desc_).value;
        pcVar3[8] = '\0';
        pcVar3[9] = '\0';
        pcVar3[10] = '\0';
        pcVar3[0xb] = '\0';
        pcVar3[0xc] = '\0';
        pcVar3[0xd] = '\0';
        pcVar3[0xe] = '\0';
        pcVar3[0xf] = '\0';
        *(in_RDI->desc_).pack = (char *)0x0;
        in_RDI->descFlag_ = '\b';
        *(ValueDesc *)((in_RDI->desc_).value + (ulong)(uint)((int)(uint)bVar1 >> 1) * 8) = VVar2;
      }
      *(char **)((in_RDI->desc_).value + (long)((int)in_ESI >> 1) * 8) = in_RDX;
    }
  }
  return in_RDI;
}

Assistant:

Value* Value::desc(DescType t, const char* n) {
	if (n == 0) return this;
	if (t == desc_implicit) {
		setProperty(property_implicit);
		if (!*n) return this;
	}
	if (descFlag_ == 0 || descFlag_ == t) {
		desc_.value = n;
		descFlag_ = static_cast<byte_t>(t);
		return this;
	}
	if (descFlag_ != desc_pack) {
		const char* oldVal = desc_.value;
		unsigned    oldKey = descFlag_ >> 1u;
		desc_.pack = (const char**)::operator new(sizeof(const char*[3]));
		desc_.pack[0] = desc_.pack[1] = desc_.pack[2] = 0;
		descFlag_ = desc_pack;
		desc_.pack[oldKey] = oldVal;
	}
	desc_.pack[t>>1u] = n;
	return this;
}